

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O1

bool __thiscall Indexing::CodeTree::RemovingMatcher<false>::next(RemovingMatcher<false> *this)

{
  BTPoint **ppBVar1;
  size_t *psVar2;
  BTPoint *pBVar3;
  SearchStruct *this_00;
  ulong uVar4;
  Stack<Indexing::CodeTree::CodeOp_*> *pSVar5;
  FlatTerm *pFVar6;
  size_t sVar7;
  CodeOp *pCVar8;
  CodeOp *pCVar9;
  pointer ppCVar10;
  uint64_t uVar11;
  size_t sVar12;
  bool bVar13;
  CodeOp *pCVar14;
  pointer ppCVar15;
  uint uVar16;
  uint uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  BTPoint local_48;
  
  if (this->fresh == true) {
    this->fresh = false;
  }
  else {
    bVar13 = backtrack(this);
    if (!bVar13) {
      return false;
    }
  }
  uVar18 = 0;
LAB_002e2b06:
  do {
    pCVar14 = ((this->super_BaseMatcher).op)->_alternative;
    if (pCVar14 != (CodeOp *)0x0) {
      BTPoint::BTPoint(&local_48,(this->super_BaseMatcher).tp,pCVar14,
                       (long)this->firstsInBlocks->_cursor - (long)this->firstsInBlocks->_stack >> 3
                      );
      sVar12 = local_48.fibDepth;
      pCVar14 = local_48.op;
      sVar7 = local_48.tp;
      if ((this->btStack)._cursor == (this->btStack)._end) {
        ::Lib::Stack<Indexing::CodeTree::RemovingMatcher<false>::BTPoint>::expand(&this->btStack);
      }
      pBVar3 = (this->btStack)._cursor;
      pBVar3->fibDepth = sVar12;
      pBVar3->tp = sVar7;
      pBVar3->op = pCVar14;
      ppBVar1 = &(this->btStack)._cursor;
      *ppBVar1 = *ppBVar1 + 1;
    }
    this_00 = (SearchStruct *)(this->super_BaseMatcher).op;
    uVar4 = (this_00->landingOp)._content;
    uVar19 = uVar18;
    switch((uint)uVar4 & 7) {
    case 0:
      uVar19 = 1;
      if ((uVar4 != 0) && (this->matchingClauses == false)) {
        return true;
      }
      break;
    case 1:
      sVar7 = (this->super_BaseMatcher).tp;
      pFVar6 = (this->super_BaseMatcher).ft;
      uVar17 = (uint)pFVar6->_data[sVar7]._content & 7;
      if ((uVar17 == 4) || (uVar17 == 1)) {
        bVar13 = uVar4 >> 3 == pFVar6[1]._data[sVar7 - 1]._content;
        if (bVar13) {
          (this->super_BaseMatcher).tp =
               ((uint)pFVar6[1]._data[sVar7]._content >> 3 & 0x7ffffff) + sVar7;
          bVar13 = true;
        }
      }
      else {
        bVar13 = false;
      }
      goto LAB_002e2d35;
    case 2:
      return true;
    case 3:
      sVar7 = (this->super_BaseMatcher).tp;
      pFVar6 = (this->super_BaseMatcher).ft;
      uVar17 = (uint)pFVar6->_data[sVar7]._content;
      uVar16 = uVar17 & 7;
      if ((uVar16 == 4) || (uVar16 == 1)) {
        bVar13 = (uVar17 >> 3 & 0x7ffffff) == (uint)(uVar4 >> 3);
      }
      else {
        bVar13 = false;
      }
      if (bVar13) {
        Kernel::FlatTerm::Entry::expand(pFVar6->_data + sVar7);
        psVar2 = &(this->super_BaseMatcher).tp;
        *psVar2 = *psVar2 + 3;
      }
LAB_002e2d35:
      uVar19 = bVar13 ^ 1;
      break;
    case 4:
      sVar7 = (this->super_BaseMatcher).tp;
      uVar17 = (uint)((this->super_BaseMatcher).ft)->_data[sVar7]._content;
      uVar16 = uVar17 & 7;
      if (uVar16 == 2) {
        *(uint *)((long)(this->bindings)._array + (uVar4 >> 1 & 0x3fffffffc)) =
             uVar17 >> 3 & 0x7ffffff;
        (this->super_BaseMatcher).tp = sVar7 + 1;
      }
      uVar19 = uVar16 != 2;
      break;
    case 5:
      sVar7 = (this->super_BaseMatcher).tp;
      uVar17 = (uint)((this->super_BaseMatcher).ft)->_data[sVar7]._content;
      uVar19 = 1;
      if (((uVar17 & 7) == 2) &&
         (*(uint *)((long)(this->bindings)._array + (uVar4 >> 1 & 0x3fffffffc)) ==
          (uVar17 >> 3 & 0x7ffffff))) {
        (this->super_BaseMatcher).tp = sVar7 + 1;
        uVar19 = 0;
      }
      break;
    case 6:
      pCVar14 = this_00[2].landingOp._alternative;
      if (pCVar14 == (CodeOp *)this_00[2].landingOp._content) {
        ppCVar10 = this_00[2].targets.
                   super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppCVar15 = (pointer)((long)this_00[2].targets.
                                   super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        this_00[2].targets.
        super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar15;
        ppCVar10[2] = (CodeOp *)(&ppCVar10[1]->_content + (long)this_00[3].landingOp._alternative);
        bVar13 = ppCVar15 <
                 this_00[3].targets.
                 super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (bVar13) {
          uVar11 = this_00[3].landingOp._content;
          *(undefined8 *)&this_00->kind =
               *(undefined8 *)(*(long *)&this_00[3].kind + 8 + (long)ppCVar15 * 0x18);
          (this_00->landingOp)._alternative = (CodeOp *)0x0;
          (this_00->landingOp)._content = uVar11;
          return bVar13;
        }
      }
      else {
        this_00[2].landingOp._alternative = (CodeOp *)&pCVar14[-2]._alternative;
        pCVar8 = (CodeOp *)pCVar14[-1]._content;
        pCVar9 = pCVar14[-1]._alternative;
        (this_00->landingOp)._alternative = pCVar14[-2]._alternative;
        (this_00->landingOp)._content = (uint64_t)pCVar8;
        pSVar5 = (Stack<Indexing::CodeTree::CodeOp_*> *)
                 this_00[2].targets.
                 super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar5->_cursor = pSVar5->_stack + (long)pCVar9;
        if (pSVar5->_stack + (long)pCVar9 == pSVar5->_end) {
          ::Lib::Stack<Indexing::CodeTree::CodeOp_*>::expand(pSVar5);
        }
        *pSVar5->_cursor = pCVar8;
        pSVar5->_cursor = pSVar5->_cursor + 1;
        bVar13 = true;
      }
      return bVar13;
    case 7:
      break;
    default:
      pCVar14 = SearchStruct::getTargetOp
                          (this_00,((this->super_BaseMatcher).ft)->_data +
                                   (this->super_BaseMatcher).tp);
      uVar19 = 1;
      if (pCVar14 != (CodeOp *)0x0) {
        (this->super_BaseMatcher).op = pCVar14;
        pSVar5 = this->firstsInBlocks;
        if (pSVar5->_cursor == pSVar5->_end) {
          ::Lib::Stack<Indexing::CodeTree::CodeOp_*>::expand(pSVar5);
        }
        *pSVar5->_cursor = pCVar14;
        pSVar5->_cursor = pSVar5->_cursor + 1;
        if (pCVar14 != (CodeOp *)0x0) goto LAB_002e2b06;
      }
    }
    uVar18 = uVar19;
    if ((bool)uVar19) {
      bVar13 = backtrack(this);
      if (!bVar13) {
        return false;
      }
    }
    else {
      (this->super_BaseMatcher).op = (this->super_BaseMatcher).op + 1;
    }
  } while( true );
}

Assistant:

bool CodeTree::RemovingMatcher<checkRange>::next()
{
  if(fresh) {
    fresh=false;
  }
  else {
    //we backtrack from what we found in the previous run
    if(!backtrack()) {
      return false;
    }
  }


  bool shouldBacktrack=false;
  for(;;) {
    if(op->alternative()) {
      btStack.push(BTPoint(tp, op->alternative(), firstsInBlocks->size()));
    }
    switch(op->_instruction()) {
      case SUCCESS_OR_FAIL:
        if(op->isFail()) {
          shouldBacktrack=true;
          break;
        }
        if(matchingClauses) {
          //we can succeed only in certain depth and that will be handled separately
          shouldBacktrack=true;
        }
        else {
          //we are matching terms in a TermCodeTree
          return true;
        }
        break;
      case LIT_END:
        ASS(matchingClauses);
        return true;
      case CHECK_GROUND_TERM:
        shouldBacktrack=!doCheckGroundTerm();
        break;
      case CHECK_FUN:
        shouldBacktrack=!doCheckFun();
        break;
      case ASSIGN_VAR:
        shouldBacktrack=!doAssignVar();
        break;
      case CHECK_VAR:
        shouldBacktrack=!doCheckVar();
        break;
      case SEARCH_STRUCT:
        if(doSearchStruct()) {
          //a new value of @b op is assigned, so restart the loop
          continue;
        }
        else {
          shouldBacktrack=true;
        }
        break;
    }
    if(shouldBacktrack) {
      if(!backtrack()) {
        return false;
      }
      // dead store, left here in case it should have been a static?
      // shouldBacktrack = false;
    }
    else {
      //the SEARCH_STRUCT operation does not appear in CodeBlocks
      ASS(!op->isSearchStruct());
      //In each CodeBlock there is always either operation LIT_END or FAIL.
      //As we haven't encountered one yet, we may safely increase the
      //operation pointer
      op++;
    }
  }
}